

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

TCGv_i64 cpu_reg_aarch64(DisasContext_conflict1 *s,int reg)

{
  int reg_local;
  DisasContext_conflict1 *s_local;
  
  if (reg == 0x1f) {
    s_local = (DisasContext_conflict1 *)new_tmp_a64_zero_aarch64(s);
  }
  else {
    s_local = (DisasContext_conflict1 *)s->uc->tcg_ctx->cpu_X[reg];
  }
  return (TCGv_i64)s_local;
}

Assistant:

TCGv_i64 cpu_reg(DisasContext *s, int reg)
{
    if (reg == 31) {
        return new_tmp_a64_zero(s);
    } else {
        return s->uc->tcg_ctx->cpu_X[reg];
    }
}